

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>,_false>
 __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
::internal_locate_impl<std::pair<int,int>>
          (btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
           *this,undefined8 key)

{
  undefined1 this_00 [8];
  undefined8 k;
  bool bVar1;
  node_type *n;
  key_compare *comp;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>,_false>
  SVar2;
  undefined1 local_40 [8];
  iterator iter;
  pair<int,_int> *key_local;
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *this_local;
  
  iter._8_8_ = key;
  n = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
      ::root((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
              *)this);
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
  ::btree_iterator((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                    *)local_40,n,0);
  while( true ) {
    k = iter._8_8_;
    this_00 = local_40;
    comp = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
           ::key_comp((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                       *)this);
    iter.node._0_4_ =
         btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
         ::lower_bound<std::pair<int,int>>
                   ((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
                     *)this_00,(pair<int,_int> *)k,comp);
    bVar1 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                    *)local_40);
    if (bVar1) break;
    local_40 = (undefined1  [8])
               btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
               ::child((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                        *)local_40,(long)iter.node._0_4_);
  }
  SVar2.value.position = iter.node._0_4_;
  SVar2.value.node =
       (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
        *)local_40;
  SVar2.value._12_4_ = 0;
  return (SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>,_false>
          )SVar2.value;
}

Assistant:

inline auto btree<P>::internal_locate_impl(
        const K &key, std::false_type /* IsCompareTo */) const
        -> SearchResult<iterator, false> {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->lower_bound(key, key_comp()).value;
            // NOTE: we don't need to walk all the way down the tree if the keys are
            // equal, but determining equality would require doing an extra comparison
            // on each node on the way down, and we will need to go all the way to the
            // leaf node in the expected case.
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return {iter};
    }